

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::setCapacity
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> newBuilder;
  size_t newSize_local;
  Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>
            ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>>(&this->builder);
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>::
  addAll<kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>>
            ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>>
                     ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_38);
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }